

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptAsyncFromSyncIterator * __thiscall
Js::JavascriptLibrary::CreateAsyncFromSyncIterator
          (JavascriptLibrary *this,RecyclableObject *syncIterator)

{
  DynamicObject *prototype;
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicTypeHandler *typeHandler;
  DynamicType *type;
  Recycler *alloc;
  JavascriptAsyncFromSyncIterator *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (((((this->super_JavascriptLibraryBase).scriptContext.ptr)->config).threadConfig)->
      m_ES2018AsyncIteration == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x19a4,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  prototype = (this->super_JavascriptLibraryBase).asyncFromSyncIteratorProtototype.ptr;
  scriptContext = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  typeHandler = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
  type = DynamicType::New(scriptContext,TypeIds_AsyncFromSyncIterator,
                          &prototype->super_RecyclableObject,(JavascriptMethod)0x0,typeHandler,false
                          ,false);
  local_50 = (undefined1  [8])&JavascriptAsyncFromSyncIterator::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x19a8;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  this_00 = (JavascriptAsyncFromSyncIterator *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
  JavascriptAsyncFromSyncIterator::JavascriptAsyncFromSyncIterator(this_00,type,syncIterator);
  return this_00;
}

Assistant:

JavascriptAsyncFromSyncIterator* JavascriptLibrary::CreateAsyncFromSyncIterator(RecyclableObject* syncIterator)
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());

        DynamicType* type = CreateAsyncFromSyncIteratorType();

        return RecyclerNew(this->GetRecycler(), JavascriptAsyncFromSyncIterator, type, syncIterator);
    }